

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O2

void __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::~basic_random_coro_file
          (basic_random_coro_file<(coro_io::execution_type)2> *this)

{
  std::__cxx11::string::~string((string *)&this->file_path_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->prw_random_file_).super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ~ExecutorWrapper(&this->executor_wrapper_);
  return;
}

Assistant:

basic_random_coro_file(coro_io::ExecutorWrapper<> *executor =
                             coro_io::get_global_block_executor())
      : basic_random_coro_file(executor->get_asio_executor()) {}